

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.cc
# Opt level: O3

CordRep * absl::lts_20250127::cord_internal::anon_unknown_10::Substring
                    (CordRep *rep,size_t offset,size_t n)

{
  ulong uVar1;
  byte bVar2;
  CordRep *pCVar3;
  
  uVar1 = rep->length;
  if (uVar1 < n) {
    __assert_fail("n <= rep->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                  ,0x28,
                  "CordRep *absl::cord_internal::(anonymous namespace)::Substring(CordRep *, size_t, size_t)"
                 );
  }
  if (uVar1 <= offset) {
    __assert_fail("offset < rep->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                  ,0x29,
                  "CordRep *absl::cord_internal::(anonymous namespace)::Substring(CordRep *, size_t, size_t)"
                 );
  }
  if (uVar1 - n < offset) {
    __assert_fail("offset <= rep->length - n",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                  ,0x2a,
                  "CordRep *absl::cord_internal::(anonymous namespace)::Substring(CordRep *, size_t, size_t)"
                 );
  }
  bVar2 = rep->tag;
  if ((bVar2 < 5) && ((bVar2 != 1 || (*(byte *)(*(long *)&rep[1].refcount + 0xc) < 5)))) {
    __assert_fail("IsDataEdge(rep)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                  ,0x2b,
                  "CordRep *absl::cord_internal::(anonymous namespace)::Substring(CordRep *, size_t, size_t)"
                 );
  }
  if (n == 0) {
    rep = (CordRep *)0x0;
  }
  else if (uVar1 == n) {
    LOCK();
    (rep->refcount).count_.super___atomic_base<int>._M_i =
         (rep->refcount).count_.super___atomic_base<int>._M_i + 2;
    UNLOCK();
  }
  else {
    pCVar3 = rep;
    if (bVar2 == 1) {
      offset = offset + rep[1].length;
      pCVar3 = *(CordRep **)&rep[1].refcount;
      bVar2 = pCVar3->tag;
    }
    if (bVar2 < 5) {
      __assert_fail("rep->IsExternal() || rep->IsFlat()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                    ,0x35,
                    "CordRep *absl::cord_internal::(anonymous namespace)::Substring(CordRep *, size_t, size_t)"
                   );
    }
    rep = (CordRep *)operator_new(0x20);
    rep->length = 0;
    rep->refcount = (atomic<int>)0x0;
    rep->tag = '\0';
    rep->storage[0] = '\0';
    rep->storage[1] = '\0';
    rep->storage[2] = '\0';
    (rep->refcount).count_.super___atomic_base<int>._M_i = 2;
    rep->length = n;
    rep->tag = '\x01';
    rep[1].length = offset;
    LOCK();
    (pCVar3->refcount).count_.super___atomic_base<int>._M_i =
         (pCVar3->refcount).count_.super___atomic_base<int>._M_i + 2;
    UNLOCK();
    *(CordRep **)&rep[1].refcount = pCVar3;
  }
  return rep;
}

Assistant:

inline CordRep* Substring(CordRep* rep, size_t offset, size_t n) {
  assert(n <= rep->length);
  assert(offset < rep->length);
  assert(offset <= rep->length - n);
  assert(IsDataEdge(rep));

  if (n == 0) return nullptr;
  if (n == rep->length) return CordRep::Ref(rep);

  if (rep->tag == SUBSTRING) {
    offset += rep->substring()->start;
    rep = rep->substring()->child;
  }

  assert(rep->IsExternal() || rep->IsFlat());
  CordRepSubstring* substring = new CordRepSubstring();
  substring->length = n;
  substring->tag = SUBSTRING;
  substring->start = offset;
  substring->child = CordRep::Ref(rep);
  return substring;
}